

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_impl.cpp
# Opt level: O0

int Al::internal::mpi::init(EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  char *__s;
  MPI_Comm comm_;
  char (*in_RDX) [57];
  undefined8 in_RSI;
  int *p;
  int provided_1;
  int result;
  int provided;
  int required;
  int flag;
  int iVar2;
  MPICommunicator *in_stack_fffffffffffffe60;
  allocator<char> *in_stack_fffffffffffffe80;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 *local_160;
  undefined1 local_152;
  undefined1 local_10a;
  int in_stack_ffffffffffffff2c;
  string *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 uVar3;
  allocator<char> in_stack_ffffffffffffff3f;
  al_exception *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_79 [2];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_20 = 3;
  MPI_Initialized(&local_1c);
  if (local_1c == 0) {
    local_28 = MPI_Init_thread(ctx,in_RSI,local_20,&local_24);
    if (local_28 != 0) {
      uVar1 = __cxa_allocate_exception(0x70);
      build_string<char_const(&)[26]>((char (*) [26])in_RDX);
      this = local_79;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      al_exception::al_exception
                (in_stack_ffffffffffffff40,
                 (string *)
                 CONCAT17(in_stack_ffffffffffffff3f,
                          CONCAT16(in_stack_ffffffffffffff3e,
                                   CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))),
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      __cxa_throw(uVar1,&al_exception::typeinfo,al_exception::~al_exception);
    }
    if (local_24 < local_20) {
      uVar3 = 1;
      __s = (char *)__cxa_allocate_exception(0x70);
      build_string<char_const(&)[32]>((char (*) [32])in_RDX);
      __a = (allocator<char> *)&stack0xffffffffffffff3f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffe90,__s,__a);
      al_exception::al_exception
                (in_stack_ffffffffffffff40,
                 (string *)
                 CONCAT17(in_stack_ffffffffffffff3f,
                          CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38))),
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      __cxa_throw(__s,&al_exception::typeinfo,al_exception::~al_exception);
    }
    (anonymous_namespace)::initialized_mpi = 1;
    local_28 = 0;
  }
  else {
    MPI_Query_thread(&stack0xffffffffffffff38);
    if (in_stack_ffffffffffffff38 < local_20) {
      local_10a = 1;
      uVar1 = __cxa_allocate_exception(0x70);
      build_string<char_const(&)[57]>(in_RDX);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      al_exception::al_exception
                (in_stack_ffffffffffffff40,
                 (string *)
                 CONCAT17(in_stack_ffffffffffffff3f,
                          CONCAT16(in_stack_ffffffffffffff3e,
                                   CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))),
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      local_10a = 0;
      __cxa_throw(uVar1,&al_exception::typeinfo,al_exception::~al_exception);
    }
  }
  MPI_Initialized(&local_1c);
  if (local_1c != 0) {
    iVar2 = 0;
    MPI_Comm_get_attr(&ompi_mpi_comm_world,0,&local_160,&local_1c);
    (anonymous_namespace)::max_tag = *local_160;
    comm_ = (MPI_Comm)operator_new(0x30);
    MPICommunicator::MPICommunicator(in_stack_fffffffffffffe60,comm_,iVar2);
    (anonymous_namespace)::al_world_comm = comm_;
    return (int)comm_;
  }
  local_152 = 1;
  uVar1 = __cxa_allocate_exception(0x70);
  build_string<char_const(&)[25]>((char (*) [25])in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  al_exception::al_exception
            (in_stack_ffffffffffffff40,
             (string *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))),
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  local_152 = 0;
  __cxa_throw(uVar1,&al_exception::typeinfo,al_exception::~al_exception);
}

Assistant:

void init(int& argc, char**& argv, MPI_Comm world_comm) {
  int flag;
#ifdef AL_MPI_SERIALIZE
  int required = MPI_THREAD_SERIALIZED;
#else
  int required = MPI_THREAD_MULTIPLE;
#endif
  MPI_Initialized(&flag);
  if (!flag) {
    int provided;
    int result = MPI_Init_thread(&argc, &argv, required, &provided);
    if (result != MPI_SUCCESS) {
      throw_al_exception("MPI initialization failed");
    }
    if (provided < required) {
      throw_al_exception("Insufficient MPI thread support");
    }
    initialized_mpi = true;
  } else {
    // Ensure that we have sufficient threading support in MPI.
    int provided;
    MPI_Query_thread(&provided);
    if (provided < required) {
      throw_al_exception(
        "MPI already initialized with insufficient thread support");
    }
  }
  // Some MPI implementations may return MPI_SUCCESS despite initialization
  // failing. This second check is a weak attempt to double-check whether
  // initialization actually worked.
  MPI_Initialized(&flag);
  if (!flag) {
    throw_al_exception("Failed to initialize MPI");
  }
  // Get the upper bound for tags; this is always set in MPI_COMM_WORLD.
  // This explicitly uses MPI_COMM_WORLD rather than world_comm because of this.
  int* p;
  MPI_Comm_get_attr(MPI_COMM_WORLD, MPI_TAG_UB, &p, &flag);
  max_tag = *p;

  al_world_comm = new MPICommunicator(world_comm);

#ifdef AL_HAS_HALF
  // Set up reduction operators for half.
  MPI_Op_create(&half_sum_reduction, true, &half_sum_op);
  MPI_Op_create(&half_prod_reduction, true, &half_prod_op);
  MPI_Op_create(&half_min_reduction, true, &half_min_op);
  MPI_Op_create(&half_max_reduction, true, &half_max_op);
#endif

#ifdef AL_HAS_BFLOAT
  // Set up reduction operators for bfloat.
  MPI_Op_create(&bfloat_sum_reduction, true, &bfloat_sum_op);
  MPI_Op_create(&bfloat_prod_reduction, true, &bfloat_prod_op);
  MPI_Op_create(&bfloat_min_reduction, true, &bfloat_min_op);
  MPI_Op_create(&bfloat_max_reduction, true, &bfloat_max_op);
#endif
}